

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O1

VkDescriptorSet __thiscall
Diligent::DynamicDescriptorSetAllocator::Allocate
          (DynamicDescriptorSetAllocator *this,VkDescriptorSetLayout SetLayout,char *DebugName)

{
  VulkanLogicalDevice *this_00;
  pointer pVVar1;
  VkDescriptorSet pVVar2;
  VkDescriptorSetLayout local_60;
  VkDescriptorSetAllocateInfo local_58;
  
  this_00 = (this->m_GlobalPoolMgr->m_DeviceVkImpl->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  pVVar1 = (this->m_AllocatedPools).
           super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->m_AllocatedPools).
      super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
      ._M_impl.super__Vector_impl_data._M_start == pVVar1) {
    pVVar2 = (VkDescriptorSet)0x0;
  }
  else {
    local_58.descriptorPool = pVVar1[-1].m_VkObject;
    local_58.pSetLayouts = &local_60;
    local_58.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
    local_58._4_4_ = 0;
    local_58.pNext = (void *)0x0;
    local_58.descriptorSetCount = 1;
    local_58._28_4_ = 0;
    local_60 = SetLayout;
    pVVar2 = VulkanUtilities::VulkanLogicalDevice::AllocateVkDescriptorSet
                       (this_00,&local_58,DebugName);
  }
  if (pVVar2 == (VkDescriptorSet)0x0) {
    DescriptorPoolManager::GetPool
              ((DescriptorPoolWrapper *)&local_58,this->m_GlobalPoolMgr,"Dynamic Descriptor Pool");
    std::
    vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
    ::
    emplace_back<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>
              ((vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>,std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T*,(VulkanUtilities::VulkanHandleTypeId)14>>>
                *)&this->m_AllocatedPools,
               (VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14> *
               )&local_58);
    VulkanUtilities::
    VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
    ~VulkanObjectWrapper
              ((VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14> *
               )&local_58);
    local_58.descriptorPool =
         (this->m_AllocatedPools).
         super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].m_VkObject;
    local_58.pSetLayouts = &local_60;
    local_58.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
    local_58._4_4_ = 0;
    local_58.pNext = (void *)0x0;
    local_58.descriptorSetCount = 1;
    local_58._28_4_ = 0;
    local_60 = SetLayout;
    pVVar2 = VulkanUtilities::VulkanLogicalDevice::AllocateVkDescriptorSet
                       (this_00,&local_58,DebugName);
  }
  return pVVar2;
}

Assistant:

VkDescriptorSet DynamicDescriptorSetAllocator::Allocate(VkDescriptorSetLayout SetLayout, const char* DebugName)
{
    VkDescriptorSet                             set           = VK_NULL_HANDLE;
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_GlobalPoolMgr.GetDeviceVkImpl().GetLogicalDevice();
    if (!m_AllocatedPools.empty())
    {
        set = AllocateDescriptorSet(LogicalDevice, m_AllocatedPools.back(), SetLayout, DebugName);
    }

    if (set == VK_NULL_HANDLE)
    {
        m_AllocatedPools.emplace_back(m_GlobalPoolMgr.GetPool("Dynamic Descriptor Pool"));
        set = AllocateDescriptorSet(LogicalDevice, m_AllocatedPools.back(), SetLayout, DebugName);
    }

    return set;
}